

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

void __thiscall mat_lib::vector<double>::save_as(vector<double> *this,string *file_name)

{
  byte bVar1;
  _Setprecision _Var2;
  logic_error *this_00;
  ostream *poVar3;
  _func_ios_base_ptr_ios_base_ptr *local_430;
  _func_ios_base_ptr_ios_base_ptr *formatter;
  string local_3c0 [32];
  ostringstream local_3a0 [8];
  ostringstream str_stream;
  long local_218;
  ofstream ofs;
  string *file_name_local;
  vector<double> *this_local;
  
  std::ofstream::ofstream(&local_218,file_name,0x10);
  bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if ((bVar1 & 1) == 0) {
    if (this->format__ == fixed) {
      local_430 = std::fixed;
    }
    else {
      local_430 = std::scientific;
    }
    poVar3 = (ostream *)std::ostream::operator<<(&local_218,local_430);
    _Var2 = std::setprecision(this->fractional_digits__);
    poVar3 = std::operator<<(poVar3,_Var2);
    operator<<(poVar3,this);
    std::ofstream::~ofstream(&local_218);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_3a0);
  poVar3 = std::operator<<((ostream *)local_3a0,"cannot open file \"");
  poVar3 = std::operator<<(poVar3,(string *)file_name);
  poVar3 = std::operator<<(poVar3,"\"! (");
  poVar3 = std::operator<<(poVar3,"save_as");
  poVar3 = std::operator<<(poVar3,"() in ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x397);
  std::operator<<(poVar3,")");
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::logic_error::logic_error(this_00,local_3c0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void vector<T>::save_as(const string &file_name) const {
        ofstream ofs(file_name);
        if(!ofs)
        {
            ostringstream str_stream;
            str_stream<<"cannot open file \""<<file_name<<"\"! ("
                      <<__func__<<"() in "<<__FILE__<<":"<<__LINE__<<")";
            throw logic_error(str_stream.str());
        }

        auto formatter = format__ == mat_lib::fixed ? std::fixed : std::scientific;
        ofs << formatter << setprecision(fractional_digits__) << *this;
    }